

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Reader * __thiscall Reader::compile(Reader *this)

{
  vector<Pheromone,_std::allocator<Pheromone>_> *pheromones;
  vector<Gate,_std::allocator<Gate>_> *gates;
  pointer pAVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  reference pvVar6;
  long lVar7;
  Command *pCVar8;
  size_type __n;
  pointer this_00;
  string current;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Command local_a0;
  string name;
  
  pheromones = &this->phrs;
  gates = &this->gts;
  do {
    this_00 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar1 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (this_00 != pAVar1) {
      Ant::step(this_00,&this->wls,pheromones,gates);
      uVar5 = (ulong)this_00->y;
      if ((long)uVar5 < 0) {
        return this;
      }
      pbVar2 = (this->lns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->lns).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar5) {
        return this;
      }
      __n = (size_type)this_00->x;
      if ((long)__n < 0) {
        return this;
      }
      if (pbVar2[uVar5]._M_string_length <= __n) {
        return this;
      }
      pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (pbVar2 + uVar5,__n);
      current.field_2._M_local_buf[0] = *pvVar6;
      current._M_dataplus._M_p = (pointer)&current.field_2;
      current._M_string_length = 1;
      current.field_2._M_local_buf[1] = '\0';
      bVar3 = std::operator==(&current,"q");
      if (bVar3) {
        bVar4 = false;
      }
      else {
        bVar3 = std::operator==(&current,"z");
        if (bVar3) {
          bVar4 = true;
          if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] == 0) {
            Ant::updatePh(this_00,&this->wls,pheromones,gates);
          }
        }
        else {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a0,"[A-Za-z]",
                     0x10);
          bVar3 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (&current,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                      &local_a0,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a0);
          bVar4 = true;
          if (bVar3) {
            std::__cxx11::string::string((string *)&name,&current);
            Ant::step(this_00,&this->wls,pheromones,gates);
            lVar7 = (long)this_00->y;
            pbVar2 = (this->lns).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)(0 < lVar7) <
                 (ulong)((long)(this->lns).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
               ((ulong)(0 < (long)this_00->x) < pbVar2[lVar7]._M_string_length)) {
              pvVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                                 (pbVar2 + lVar7,(long)this_00->x);
              local_a0.name.field_2._M_local_buf[0] = *pvVar6;
              local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
              local_a0.name._M_string_length = 1;
              local_a0.name.field_2._M_local_buf[1] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&current,&local_a0.name);
              std::__cxx11::string::~string((string *)&local_a0);
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              arg._M_dataplus._M_p = (pointer)&arg.field_2;
              arg._M_string_length = 0;
              arg.field_2._M_local_buf[0] = '\0';
              while (bVar4 = std::operator==(&current,"`"), !bVar4) {
                Ant::step(this_00,&this->wls,pheromones,gates);
                pbVar2 = (this->lns).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((ulong)((long)(this->lns).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                     <= (ulong)(0 < (long)this_00->y)) ||
                   (pbVar2[this_00->y]._M_string_length <= (ulong)(0 < this_00->x)))
                goto LAB_00104e00;
                bVar3 = std::operator==(&current,";");
                if (bVar3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&args,&arg);
                  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
                  local_a0.name._M_string_length = 0;
                  local_a0.name.field_2._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&arg,&local_a0.name);
                  std::__cxx11::string::~string((string *)&local_a0);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&arg,&current);
                }
                lVar7 = (long)this_00->y;
                pbVar2 = (this->lns).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((ulong)((long)(this->lns).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                     <= (ulong)(0 < lVar7)) ||
                   (pbVar2[lVar7]._M_string_length <= (ulong)(0 < (long)this_00->x)))
                goto LAB_00104e00;
                pvVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                                   (pbVar2 + lVar7,(long)this_00->x);
                local_a0.name.field_2._M_local_buf[0] = *pvVar6;
                local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
                local_a0.name._M_string_length = 1;
                local_a0.name.field_2._M_local_buf[1] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&current,&local_a0.name);
                std::__cxx11::string::~string((string *)&local_a0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&args,&arg);
              Command::Command(&local_a0,&name,&args,&this->stack);
              pCVar8 = Command::execute(&local_a0);
              std::vector<int,_std::allocator<int>_>::operator=(&this->stack,&pCVar8->stack);
              Command::~Command(&local_a0);
LAB_00104e00:
              std::__cxx11::string::~string((string *)&arg);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&args);
            }
            else {
              bVar4 = false;
            }
            std::__cxx11::string::~string((string *)&name);
          }
        }
      }
      std::__cxx11::string::~string((string *)&current);
      this_00 = this_00 + 1;
      if (bVar4 == false) {
        return this;
      }
    }
  } while( true );
}

Assistant:

Reader& compile() {
            while (true) {
                for (Ant & ant : nts) {
                    ant.step(wls, phrs, gts);
                    if (0 > ant.y || ant.y >= lns.size() || 0 > ant.x || ant.x >= lns[ant.y].size())
                        return *this;
                    string current(1, lns[ant.y].at(ant.x));
                    if (current == "q") return *this;
                    else if (current == "z") {
                        if (stack[stack.size() - 1] == 0) { ant.updatePh(wls, phrs, gts); }
                    }
                    else if (regex_match(current, regex("[A-Za-z]"))) {
                        string name = current;
                        ant.step(wls, phrs, gts);
                        if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                            return *this;
                        current = string(1, lns[ant.y].at(ant.x));
                        vector<string> args;
                        string arg;
                        while (current != "`") {
                            ant.step(wls, phrs, gts);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            if (current == ";") {
                                args.push_back(arg);
                                arg = string();
                            } else
                                arg.append(current);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            current = string(1, lns[ant.y].at(ant.x));
                        } args.push_back(arg);
                        stack = Command(name, args, stack).execute().getStack();
                    }
                }
            }
        }